

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.hpp
# Opt level: O0

void __thiscall cs::function::function(function *this,function *param_2)

{
  long in_RSI;
  long in_RDI;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_00000008;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_00000010;
  deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *in_stack_00000078;
  deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *in_stack_00000080;
  shared_ptr<cs::context_type> *in_stack_ffffffffffffffb8;
  shared_ptr<cs::context_type> *in_stack_ffffffffffffffc0;
  
  std::shared_ptr<cs::context_type>::shared_ptr(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8)
  ;
  *(byte *)(in_RDI + 0x10) = *(byte *)(in_RSI + 0x10) & 1;
  std::__cxx11::string::string((string *)(in_RDI + 0x18),(string *)(in_RSI + 0x18));
  *(undefined4 *)(in_RDI + 0x3f) = *(undefined4 *)(in_RSI + 0x3f);
  *(undefined8 *)(in_RDI + 0x38) = *(undefined8 *)(in_RSI + 0x38);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(in_stack_00000010,in_stack_00000008);
  std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::deque
            (in_stack_00000080,in_stack_00000078);
  *(undefined8 *)(in_RDI + 0xb0) = *(undefined8 *)(in_RSI + 0xb0);
  return;
}

Assistant:

function(const function &) = default;